

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner-unix.c
# Opt level: O1

int process_wait(process_info_t *vec,int n,int timeout)

{
  process_info_t *ppVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  uint uVar6;
  long lVar7;
  timeval tv;
  dowait_args args;
  timeval timebase;
  pthread_t tid;
  fd_set fds;
  pthread_attr_t attr;
  timeval local_138;
  int local_120 [2];
  process_info_t *local_118;
  int local_110;
  process_info_t *local_108;
  timeval local_100;
  pthread_t local_f0;
  fd_set local_e8;
  pthread_attr_t local_68;
  
  local_120[0] = -1;
  local_120[1] = -1;
  local_118 = vec;
  local_110 = n;
  if (timeout == -1) {
    dowait(local_120);
    iVar2 = 0;
  }
  else {
    iVar2 = pipe(local_120);
    if (iVar2 == 0) {
      iVar2 = pthread_attr_init(&local_68);
      if ((iVar2 == 0) && (iVar2 = pthread_attr_setstacksize(&local_68,0x40000), iVar2 == 0)) {
        iVar2 = pthread_create(&local_f0,&local_68,dowait,local_120);
        iVar3 = pthread_attr_destroy(&local_68);
        if (iVar3 == 0) {
          if (iVar2 != 0) {
            perror("pthread_create()");
            iVar2 = -1;
LAB_00150047:
            close(local_120[0]);
            close(local_120[1]);
            return iVar2;
          }
          local_108 = vec;
          iVar2 = gettimeofday(&local_100,(__timezone_ptr_t)0x0);
          if (iVar2 == 0) {
            local_138.tv_sec = local_100.tv_sec;
            local_138.tv_usec = local_100.tv_usec;
            iVar2 = 0;
            do {
              if ((local_138.tv_sec <= local_100.tv_sec) &&
                 ((local_138.tv_sec != local_100.tv_sec || (local_138.tv_usec < local_100.tv_usec)))
                 ) {
                __assert_fail("tv.tv_sec > timebase.tv_sec || (tv.tv_sec == timebase.tv_sec && tv.tv_usec >= timebase.tv_usec)"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/runner-unix.c"
                              ,0x122,"int process_wait(process_info_t *, int, int)");
              }
              uVar6 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_138.tv_usec),8) >> 7
                            ) - (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_138.tv_usec),0xc
                                       ) >> 0x1f)) +
                      ((int)(SUB168(SEXT816(local_100.tv_usec) * SEXT816(-0x20c49ba5e353f7cf),8) >>
                            7) -
                      (SUB164(SEXT816(local_100.tv_usec) * SEXT816(-0x20c49ba5e353f7cf),0xc) >> 0x1f
                      )) + ((int)local_138.tv_sec - (int)local_100.tv_sec) * 1000;
              uVar4 = timeout - uVar6;
              if ((uint)timeout < uVar6 || uVar4 == 0) {
                iVar3 = 0;
LAB_0014ffe6:
                ppVar1 = local_108;
                if (iVar3 == 0) {
                  iVar2 = -2;
                  if (0 < n) {
                    lVar7 = 0;
                    do {
                      kill(*(__pid_t *)((long)&ppVar1->pid + lVar7),0xf);
                      lVar7 = lVar7 + 0x20;
                    } while ((ulong)(uint)n << 5 != lVar7);
                  }
                }
                else if (iVar3 == -1) {
                  perror("select()");
                  iVar2 = -1;
                }
                iVar3 = pthread_join(local_f0,(void **)0x0);
                if (iVar3 == 0) goto LAB_00150047;
                break;
              }
              local_138.tv_sec = (ulong)uVar4 / 1000;
              local_138.tv_usec = (__suseconds_t)((uVar4 % 1000) * 1000);
              local_e8.fds_bits[0] = 0;
              local_e8.fds_bits[1] = 0;
              local_e8.fds_bits[2] = 0;
              local_e8.fds_bits[3] = 0;
              local_e8.fds_bits[4] = 0;
              local_e8.fds_bits[5] = 0;
              local_e8.fds_bits[6] = 0;
              local_e8.fds_bits[7] = 0;
              local_e8.fds_bits[8] = 0;
              local_e8.fds_bits[9] = 0;
              local_e8.fds_bits[10] = 0;
              local_e8.fds_bits[0xb] = 0;
              iVar3 = local_120[0] + 0x3f;
              if (-1 < local_120[0]) {
                iVar3 = local_120[0];
              }
              local_e8.fds_bits[0xc] = 0;
              local_e8.fds_bits[0xd] = 0;
              local_e8.fds_bits[0xe] = 0;
              local_e8.fds_bits[0xf] = 0;
              local_e8.fds_bits[iVar3 >> 6] =
                   local_e8.fds_bits[iVar3 >> 6] | 1L << ((byte)(local_120[0] % 0x40) & 0x3f);
              iVar3 = select(local_120[0] + 1,&local_e8,(fd_set *)0x0,(fd_set *)0x0,&local_138);
              if (iVar3 != -1) goto LAB_0014ffe6;
              piVar5 = __errno_location();
              if (*piVar5 != 4) {
                iVar3 = -1;
                goto LAB_0014ffe6;
              }
              iVar3 = gettimeofday(&local_138,(__timezone_ptr_t)0x0);
            } while (iVar3 == 0);
          }
        }
      }
      abort();
    }
    perror("pipe()");
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int process_wait(process_info_t* vec, int n, int timeout) {
  int i;
  int r;
  int retval;
  process_info_t* p;
  dowait_args args;
  pthread_t tid;
  pthread_attr_t attr;
  unsigned int elapsed_ms;
  struct timeval timebase;
  struct timeval tv;
  fd_set fds;

  args.vec = vec;
  args.n = n;
  args.pipe[0] = -1;
  args.pipe[1] = -1;

  /* The simple case is where there is no timeout */
  if (timeout == -1) {
    dowait(&args);
    return 0;
  }

  /* Hard case. Do the wait with a timeout.
   *
   * Assumption: we are the only ones making this call right now. Otherwise
   * we'd need to lock vec.
   */

  r = pipe((int*)&(args.pipe));
  if (r) {
    perror("pipe()");
    return -1;
  }

  if (pthread_attr_init(&attr))
    abort();

#if defined(__MVS__)
  if (pthread_attr_setstacksize(&attr, 1024 * 1024))
#else
  if (pthread_attr_setstacksize(&attr, 256 * 1024))
#endif
    abort();

  r = pthread_create(&tid, &attr, dowait, &args);

  if (pthread_attr_destroy(&attr))
    abort();

  if (r) {
    perror("pthread_create()");
    retval = -1;
    goto terminate;
  }

  if (gettimeofday(&timebase, NULL))
    abort();

  tv = timebase;
  for (;;) {
    /* Check that gettimeofday() doesn't jump back in time. */
    assert(tv.tv_sec > timebase.tv_sec ||
           (tv.tv_sec == timebase.tv_sec && tv.tv_usec >= timebase.tv_usec));

    elapsed_ms =
        (tv.tv_sec - timebase.tv_sec) * 1000 +
        (tv.tv_usec / 1000) -
        (timebase.tv_usec / 1000);

    r = 0;  /* Timeout. */
    if (elapsed_ms >= (unsigned) timeout)
      break;

    tv.tv_sec = (timeout - elapsed_ms) / 1000;
    tv.tv_usec = (timeout - elapsed_ms) % 1000 * 1000;

    FD_ZERO(&fds);
    FD_SET(args.pipe[0], &fds);

    r = select(args.pipe[0] + 1, &fds, NULL, NULL, &tv);
    if (!(r == -1 && errno == EINTR))
      break;

    if (gettimeofday(&tv, NULL))
      abort();
  }

  if (r == -1) {
    perror("select()");
    retval = -1;

  } else if (r) {
    /* The thread completed successfully. */
    retval = 0;

  } else {
    /* Timeout. Kill all the children. */
    for (i = 0; i < n; i++) {
      p = &vec[i];
      kill(p->pid, SIGTERM);
    }
    retval = -2;
  }

  if (pthread_join(tid, NULL))
    abort();

terminate:
  close(args.pipe[0]);
  close(args.pipe[1]);
  return retval;
}